

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O1

bool __thiscall
PcodeGenerator::CanInline(PcodeGenerator *this,string *top_label,string *bottom_label)

{
  PcodeType PVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  iterator iter;
  pointer pPVar4;
  pointer pPVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  bool bVar9;
  string num1;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  string *local_48;
  string *local_40;
  PcodeGenerator *local_38;
  
  local_48 = top_label;
  local_40 = bottom_label;
  iVar3 = std::__cxx11::string::compare((char *)top_label);
  if (iVar3 == 0) {
    bVar9 = false;
  }
  else {
    pPVar5 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pPVar5 == (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pPVar6 = (pointer)0x0;
      pPVar4 = (pointer)0x0;
    }
    else {
      pPVar7 = (pointer)0x0;
      pPVar8 = (pointer)0x0;
      local_38 = this;
      do {
        PVar1 = pPVar5->m_op;
        local_68 = local_58;
        pcVar2 = (pPVar5->m_num1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar2,pcVar2 + (pPVar5->m_num1)._M_string_length);
        __n = local_60;
        if (local_60 == local_48->_M_string_length) {
          if (local_60 == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(local_68,(local_48->_M_dataplus)._M_p,local_60);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        pPVar4 = pPVar7;
        if (bVar9) {
          pPVar4 = pPVar5;
        }
        if (PVar1 != LABEL) {
          pPVar4 = pPVar7;
        }
        if (__n == local_40->_M_string_length) {
          if (__n == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(local_68,(local_40->_M_dataplus)._M_p,__n);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        pPVar6 = pPVar8;
        if (bVar9) {
          pPVar6 = pPVar5;
        }
        if (PVar1 != LABEL) {
          pPVar6 = pPVar8;
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        pPVar5 = pPVar5 + 1;
        pPVar7 = pPVar4;
        pPVar8 = pPVar6;
      } while (pPVar5 != (local_38->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar9 = pPVar4 == pPVar6;
    if (!bVar9) {
      do {
        PVar1 = pPVar4->m_op;
        pcVar2 = (pPVar4->m_num1)._M_dataplus._M_p;
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar2,pcVar2 + (pPVar4->m_num1)._M_string_length);
        if ((ulong)PVar1 == 0xe) {
          iVar3 = std::__cxx11::string::compare((char *)&local_68);
          if (iVar3 != 0) goto LAB_001356e7;
        }
        else if (PVar1 == CALL) goto LAB_001356e7;
        if (*pcode_string[PVar1] == 'B') {
LAB_001356e7:
          if (local_68 == local_58) {
            return bVar9;
          }
          operator_delete(local_68);
          return bVar9;
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        pPVar4 = pPVar4 + 1;
        bVar9 = pPVar4 == pPVar6;
      } while (!bVar9);
    }
  }
  return bVar9;
}

Assistant:

bool PcodeGenerator::CanInline(const string& top_label, const string& bottom_label) {
    if (top_label == "main")
        return false;
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    auto iter = m_pcode_queue.begin();
    for (; iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    for (auto iter = iter_top; iter != iter_bottom; ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if ((op == JUMP && num1 != "RA") || op == CALL || pcode_string[op][0] == 'B')
        //if ((op == JUMP && num1 != "RA") || op == CALL)
            return false;
    }
    return true;
}